

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::TypeSpecializeUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,Value *src1OriginalVal,
          bool *redoTypeSpecRef,bool *forceInvariantHoistingRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  int32 local_40;
  int32 local_3c;
  int32 min;
  int32 max;
  Value **pDstVal_00;
  
  _min = pDstVal;
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1dbc,"(pSrc1Val)","pSrc1Val");
    if (!bVar2) goto LAB_00455fa2;
    *puVar3 = 0;
  }
  if (*pSrc1Val == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1dbe,"(src1Val)","src1Val");
    if (!bVar2) {
LAB_00455fa2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = IsTypeSpecPhaseOff(this->func);
  if ((!bVar2) && ((this->field_0xf7 & 2) == 0)) {
    bVar2 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
    if (bVar2) {
      TypeSpecializeInlineBuiltInUnary(this,pInstr,pSrc1Val,_min,src1OriginalVal,redoTypeSpecRef);
      return true;
    }
    if (((*pInstr)->m_opcode == LdLen_A) &&
       (bVar2 = TypeSpecializeLdLen(this,pInstr,pSrc1Val,_min,forceInvariantHoistingRef), bVar2)) {
      return true;
    }
    uVar4 = *(uint *)&this->field_0xf4 >> 9 & 1;
    pDstVal_00 = (Value **)(ulong)uVar4;
    bVar2 = ValueInfo::GetIntValMinMax((*pSrc1Val)->valueInfo,&local_40,&local_3c,SUB41(uVar4,0));
    if (bVar2) {
      bVar2 = TypeSpecializeIntUnary
                        (this,pInstr,pSrc1Val,_min,local_40,local_3c,src1OriginalVal,redoTypeSpecRef
                         ,false);
      return bVar2;
    }
    *pSrc1Val = src1OriginalVal;
    bVar2 = ValueType::IsLikelyFloat(&src1OriginalVal->valueInfo->super_ValueType);
    if (bVar2) {
      bVar2 = TypeSpecializeFloatUnary(this,pInstr,*pSrc1Val,_min,false);
      return bVar2;
    }
    bVar2 = ValueType::IsNumber(&(*pSrc1Val)->valueInfo->super_ValueType);
    if (bVar2) {
      TypeSpecializeNumberUnary(this,*pInstr,*pSrc1Val,pDstVal_00);
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::TypeSpecializeUnary(
    IR::Instr **pInstr,
    Value **pSrc1Val,
    Value **pDstVal,
    Value *const src1OriginalVal,
    bool *redoTypeSpecRef,
    bool *const forceInvariantHoistingRef)
{
    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;
    Assert(src1Val);

    // We don't need to do typespec for asmjs
    if (IsTypeSpecPhaseOff(this->func) || GetIsAsmJSFunc())
    {
        return false;
    }

    IR::Instr *&instr = *pInstr;
    int32 min, max;

    // Inline built-ins explicitly specify how srcs/dst must be specialized.
    if (OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        TypeSpecializeInlineBuiltInUnary(pInstr, &src1Val, pDstVal, src1OriginalVal, redoTypeSpecRef);
        return true;
    }

    // Consider: If type spec wasn't completely done, make sure that we don't type-spec the dst 2nd time.
    if(instr->m_opcode == Js::OpCode::LdLen_A && TypeSpecializeLdLen(&instr, &src1Val, pDstVal, forceInvariantHoistingRef))
    {
        return true;
    }

    if (!src1Val->GetValueInfo()->GetIntValMinMax(&min, &max, this->DoAggressiveIntTypeSpec()))
    {
        src1Val = src1OriginalVal;
        if (src1Val->GetValueInfo()->IsLikelyFloat())
        {
            // Try to type specialize to float
            return this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal);
        }
        else if (src1Val->GetValueInfo()->IsNumber())
        {
            return TypeSpecializeNumberUnary(instr, src1Val, pDstVal);
        }
        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
    }

    return this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, min, max, src1OriginalVal, redoTypeSpecRef);
}